

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_helpers.cc
# Opt level: O0

string * google::protobuf::compiler::javanano::ToJavaName
                   (string *__return_storage_ptr__,Params *params,string *name,bool is_class,
                   Descriptor *parent,FileDescriptor *file)

{
  string *this;
  bool bVar1;
  string *file_name;
  ulong uVar2;
  string *file_00;
  string local_d0;
  string local_b0;
  string local_90;
  string local_60;
  undefined1 local_39;
  Params *local_38;
  FileDescriptor *file_local;
  Descriptor *parent_local;
  string *psStack_20;
  bool is_class_local;
  string *name_local;
  Params *params_local;
  string *result;
  
  local_39 = 0;
  file_00 = __return_storage_ptr__;
  local_38 = (Params *)file;
  file_local = (FileDescriptor *)parent;
  parent_local._7_1_ = is_class;
  psStack_20 = name;
  name_local = &params->empty_;
  params_local = (Params *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  this = name_local;
  if (file_local == (FileDescriptor *)0x0) {
    if ((parent_local._7_1_ & 1) != 0) {
      file_name = FileDescriptor::name_abi_cxx11_((FileDescriptor *)local_38);
      bVar1 = Params::java_multiple_files((Params *)this,file_name);
      if (bVar1) {
        FileJavaPackage_abi_cxx11_
                  (&local_90,(javanano *)name_local,local_38,(FileDescriptor *)file_00);
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&local_90);
        goto LAB_0038ec41;
      }
    }
    ClassName_abi_cxx11_(&local_b0,(javanano *)name_local,local_38,(FileDescriptor *)file_00);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  else {
    ClassName_abi_cxx11_
              (&local_60,(javanano *)name_local,(Params *)file_local,(Descriptor *)file_00);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_60);
  }
LAB_0038ec41:
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::__cxx11::string::append((ulong)__return_storage_ptr__,'\x01');
  }
  RenameJavaKeywords(&local_d0,psStack_20);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_d0);
  return __return_storage_ptr__;
}

Assistant:

string ToJavaName(const Params& params, const string& name, bool is_class,
    const Descriptor* parent, const FileDescriptor* file) {
  string result;
  if (parent != NULL) {
    result.append(ClassName(params, parent));
  } else if (is_class && params.java_multiple_files(file->name())) {
    result.append(FileJavaPackage(params, file));
  } else {
    result.append(ClassName(params, file));
  }
  if (!result.empty()) result.append(1, '.');
  result.append(RenameJavaKeywords(name));
  return result;
}